

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

void __thiscall ContextField::saveXml(ContextField *this,ostream *s)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<contextfield",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(s," signbit=\"",10);
  if (this->signbit == true) {
    pcVar3 = "true\"";
    lVar2 = 5;
  }
  else {
    pcVar3 = "false\"";
    lVar2 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>(s," startbit=\"",0xb);
  *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(*(long *)s + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(s,this->startbit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," endbit=\"",9);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->endbit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," startbyte=\"",0xc);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->startbyte);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," endbyte=\"",10);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->endbyte);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(s," shift=\"",8);
  poVar1 = (ostream *)std::ostream::operator<<(s,this->shift);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"/>\n",4);
  return;
}

Assistant:

void ContextField::saveXml(ostream &s) const

{
  s << "<contextfield";
  s << " signbit=\"";
  if (signbit)
    s << "true\"";
  else
    s << "false\"";
  s << " startbit=\"" << dec << startbit << "\"";
  s << " endbit=\"" << endbit << "\"";
  s << " startbyte=\"" << startbyte << "\"";
  s << " endbyte=\"" << endbyte << "\"";
  s << " shift=\"" << shift << "\"/>\n";
}